

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<QString,_QCss::StyleRule>::~MultiNode
          (MultiNode<QString,_QCss::StyleRule> *this)

{
  void *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    MultiNodeChain<QCss::StyleRule>::free
              (*(MultiNodeChain<QCss::StyleRule> **)(in_RDI + 0x18),in_RSI);
  }
  QString::~QString((QString *)0x7c6086);
  return;
}

Assistant:

~MultiNode()
    {
        if (value)
            value->free();
    }